

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_map.cpp
# Opt level: O1

void Rotate(CPoint *pCenter,CPoint *pPoint,float Rotation)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  iVar1 = pPoint->y;
  iVar2 = pCenter->y;
  fVar3 = (float)(pPoint->x - pCenter->x);
  fVar4 = cosf(Rotation);
  fVar5 = (float)(iVar1 - iVar2);
  fVar6 = sinf(Rotation);
  pPoint->x = (int)((float)pCenter->x + (fVar4 * fVar3 - fVar6 * fVar5));
  fVar4 = sinf(Rotation);
  fVar6 = cosf(Rotation);
  pPoint->y = (int)((float)pCenter->y + fVar4 * fVar3 + fVar6 * fVar5);
  return;
}

Assistant:

static void Rotate(const CPoint *pCenter, CPoint *pPoint, float Rotation)
{
	int x = pPoint->x - pCenter->x;
	int y = pPoint->y - pCenter->y;
	pPoint->x = (int)(x * cosf(Rotation) - y * sinf(Rotation) + pCenter->x);
	pPoint->y = (int)(x * sinf(Rotation) + y * cosf(Rotation) + pCenter->y);
}